

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O1

void ImGui::ShowStyleEditor(ImGuiStyle *ref)

{
  ImFontConfig *pIVar1;
  float fVar2;
  ImDrawList *draw_list;
  bool bVar3;
  bool bVar4;
  ImU32 IVar5;
  ImGuiStyle *v;
  char *pcVar6;
  size_t sVar7;
  ImGuiIO *pIVar8;
  ImFontGlyph *pIVar9;
  int i;
  long lVar10;
  ulong uVar11;
  void *ptr_id;
  uint uVar12;
  ImVec4 *pIVar13;
  ImWchar c;
  int n_1;
  ImFontAtlas *pIVar14;
  ImVec4 *pIVar15;
  int n;
  int iVar16;
  uint uVar17;
  ImGuiStyle *__dest;
  int i_1;
  ImFont *pIVar18;
  float fVar19;
  float fVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  bool window_border;
  ImVec2 cell_p2;
  ImVec4 local_d0;
  float local_bc;
  ImFont *local_b8;
  float *local_b0;
  ImVec4 local_a8;
  ImFontAtlas *local_98;
  ulong local_90;
  void *local_88;
  ImDrawList *local_80;
  ImVec2 local_78;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  ImVec2 local_58;
  undefined8 uStack_50;
  ImVec2 local_48;
  ImVec2 local_40;
  ImVec2 local_38;
  
  v = GetStyle();
  if (ShowStyleEditor(ImGuiStyle*)::ref_saved_style == '\0') {
    iVar16 = __cxa_guard_acquire(&ShowStyleEditor(ImGuiStyle*)::ref_saved_style);
    if (iVar16 != 0) {
      ImGuiStyle::ImGuiStyle(&ShowStyleEditor::ref_saved_style);
      __cxa_guard_release(&ShowStyleEditor(ImGuiStyle*)::ref_saved_style);
    }
  }
  if ((ref == (ImGuiStyle *)0x0) && ((ShowStyleEditor(ImGuiStyle*)::init & 1) == 0)) {
    memcpy(&ShowStyleEditor::ref_saved_style,v,0x338);
  }
  ShowStyleEditor(ImGuiStyle*)::init = 1;
  __dest = &ShowStyleEditor::ref_saved_style;
  if (ref != (ImGuiStyle *)0x0) {
    __dest = ref;
  }
  fVar19 = GetWindowWidth();
  PushItemWidth(fVar19 * 0.5);
  bVar3 = ShowStyleSelector("Colors##Selector");
  if (bVar3) {
    memcpy(&ShowStyleEditor::ref_saved_style,v,0x338);
  }
  ShowFontSelector("Fonts##Selector");
  local_b0 = &v->FrameRounding;
  bVar3 = SliderFloat("FrameRounding",local_b0,0.0,12.0,"%.0f",1.0);
  if (bVar3) {
    v->GrabRounding = v->FrameRounding;
  }
  local_d0.x._0_1_ = 0.0 < v->WindowBorderSize;
  bVar3 = Checkbox("WindowBorder",(bool *)&local_d0);
  if (bVar3) {
    if (local_d0.x._0_1_ == '\0') {
      fVar19 = 0.0;
    }
    else {
      fVar19 = 1.0;
    }
    v->WindowBorderSize = fVar19;
  }
  SameLine(0.0,-1.0);
  local_d0.x._0_1_ = 0.0 < v->FrameBorderSize;
  bVar3 = Checkbox("FrameBorder",(bool *)&local_d0);
  if (bVar3) {
    if (local_d0.x._0_1_ == '\0') {
      fVar19 = 0.0;
    }
    else {
      fVar19 = 1.0;
    }
    v->FrameBorderSize = fVar19;
  }
  SameLine(0.0,-1.0);
  local_d0.x._0_1_ = 0.0 < v->PopupBorderSize;
  bVar3 = Checkbox("PopupBorder",(bool *)&local_d0);
  if (bVar3) {
    fVar19 = 1.0;
    if (local_d0.x._0_1_ == '\0') {
      fVar19 = 0.0;
    }
    v->PopupBorderSize = fVar19;
  }
  local_d0.x = 0.0;
  local_d0.y = 0.0;
  bVar3 = Button("Save Ref",(ImVec2 *)&local_d0);
  if (bVar3) {
    memcpy(&ShowStyleEditor::ref_saved_style,v,0x338);
    memmove(__dest,v,0x338);
  }
  SameLine(0.0,-1.0);
  local_d0.x = 0.0;
  local_d0.y = 0.0;
  bVar3 = Button("Revert Ref",(ImVec2 *)&local_d0);
  if (bVar3) {
    memcpy(v,__dest,0x338);
  }
  SameLine(0.0,-1.0);
  ShowHelpMarker(
                "Save/Revert in local non-persistent storage. Default Colors definition are not affected. Use \"Export Colors\" below to save them somewhere."
                );
  bVar3 = TreeNode("Rendering");
  if (bVar3) {
    Checkbox("Anti-aliased lines",&v->AntiAliasedLines);
    SameLine(0.0,-1.0);
    ShowHelpMarker(
                  "When disabling anti-aliasing lines, you\'ll probably want to disable borders in your style as well."
                  );
    Checkbox("Anti-aliased fill",&v->AntiAliasedFill);
    PushItemWidth(100.0);
    DragFloat("Curve Tessellation Tolerance",&v->CurveTessellationTol,0.02,0.1,3.4028235e+38,
              (char *)0x0,2.0);
    if (v->CurveTessellationTol <= 0.0 && v->CurveTessellationTol != 0.0) {
      v->CurveTessellationTol = 0.1;
    }
    DragFloat("Global Alpha",&v->Alpha,0.005,0.2,1.0,"%.2f",1.0);
    PopItemWidth();
    TreePop();
  }
  bVar3 = TreeNode("Settings");
  if (bVar3) {
    SliderFloat2("WindowPadding",&(v->WindowPadding).x,0.0,20.0,"%.0f",1.0);
    SliderFloat("PopupRounding",&v->PopupRounding,0.0,16.0,"%.0f",1.0);
    SliderFloat2("FramePadding",&(v->FramePadding).x,0.0,20.0,"%.0f",1.0);
    SliderFloat2("ItemSpacing",&(v->ItemSpacing).x,0.0,20.0,"%.0f",1.0);
    SliderFloat2("ItemInnerSpacing",&(v->ItemInnerSpacing).x,0.0,20.0,"%.0f",1.0);
    SliderFloat2("TouchExtraPadding",&(v->TouchExtraPadding).x,0.0,10.0,"%.0f",1.0);
    SliderFloat("IndentSpacing",&v->IndentSpacing,0.0,30.0,"%.0f",1.0);
    SliderFloat("ScrollbarSize",&v->ScrollbarSize,1.0,20.0,"%.0f",1.0);
    SliderFloat("GrabMinSize",&v->GrabMinSize,1.0,20.0,"%.0f",1.0);
    Text("BorderSize");
    SliderFloat("WindowBorderSize",&v->WindowBorderSize,0.0,1.0,"%.0f",1.0);
    SliderFloat("ChildBorderSize",&v->ChildBorderSize,0.0,1.0,"%.0f",1.0);
    SliderFloat("PopupBorderSize",&v->PopupBorderSize,0.0,1.0,"%.0f",1.0);
    SliderFloat("FrameBorderSize",&v->FrameBorderSize,0.0,1.0,"%.0f",1.0);
    Text("Rounding");
    SliderFloat("WindowRounding",&v->WindowRounding,0.0,14.0,"%.0f",1.0);
    SliderFloat("ChildRounding",&v->ChildRounding,0.0,16.0,"%.0f",1.0);
    SliderFloat("FrameRounding",local_b0,0.0,12.0,"%.0f",1.0);
    SliderFloat("ScrollbarRounding",&v->ScrollbarRounding,0.0,12.0,"%.0f",1.0);
    SliderFloat("GrabRounding",&v->GrabRounding,0.0,12.0,"%.0f",1.0);
    Text("Alignment");
    SliderFloat2("WindowTitleAlign",&(v->WindowTitleAlign).x,0.0,1.0,"%.2f",1.0);
    SliderFloat2("ButtonTextAlign",&(v->ButtonTextAlign).x,0.0,1.0,"%.2f",1.0);
    SameLine(0.0,-1.0);
    ShowHelpMarker("Alignment applies when a button is larger than its text content.");
    Text("Safe Area Padding");
    SameLine(0.0,-1.0);
    ShowHelpMarker(
                  "Adjust if you cannot see the edges of your screen (e.g. on a TV where scaling has not been configured)."
                  );
    SliderFloat2("DisplaySafeAreaPadding",&(v->DisplaySafeAreaPadding).x,0.0,30.0,"%.0f",1.0);
    TreePop();
  }
  bVar3 = TreeNode("Colors");
  if (bVar3) {
    local_d0.x = 0.0;
    local_d0.y = 0.0;
    bVar3 = Button("Export Unsaved",(ImVec2 *)&local_d0);
    if (bVar3) {
      if (ShowStyleEditor::output_dest == 0) {
        LogToClipboard(-1);
      }
      else {
        LogToTTY(-1);
      }
      lVar10 = 0;
      LogText("ImVec4* colors = ImGui::GetStyle().Colors;\n");
      pIVar15 = v->Colors;
      pIVar13 = __dest->Colors;
      do {
        pcVar6 = GetStyleColorName((ImGuiCol)lVar10);
        if ((ShowStyleEditor::output_only_modified != true) ||
           (auVar21[0] = -(*(char *)&pIVar13->x == *(char *)&pIVar15->x),
           auVar21[1] = -(*(char *)((long)&pIVar13->x + 1) == *(char *)((long)&pIVar15->x + 1)),
           auVar21[2] = -(*(char *)((long)&pIVar13->x + 2) == *(char *)((long)&pIVar15->x + 2)),
           auVar21[3] = -(*(char *)((long)&pIVar13->x + 3) == *(char *)((long)&pIVar15->x + 3)),
           auVar21[4] = -(*(char *)&pIVar13->y == *(char *)&pIVar15->y),
           auVar21[5] = -(*(char *)((long)&pIVar13->y + 1) == *(char *)((long)&pIVar15->y + 1)),
           auVar21[6] = -(*(char *)((long)&pIVar13->y + 2) == *(char *)((long)&pIVar15->y + 2)),
           auVar21[7] = -(*(char *)((long)&pIVar13->y + 3) == *(char *)((long)&pIVar15->y + 3)),
           auVar21[8] = -(*(char *)&pIVar13->z == *(char *)&pIVar15->z),
           auVar21[9] = -(*(char *)((long)&pIVar13->z + 1) == *(char *)((long)&pIVar15->z + 1)),
           auVar21[10] = -(*(char *)((long)&pIVar13->z + 2) == *(char *)((long)&pIVar15->z + 2)),
           auVar21[0xb] = -(*(char *)((long)&pIVar13->z + 3) == *(char *)((long)&pIVar15->z + 3)),
           auVar21[0xc] = -(*(char *)&pIVar13->w == *(char *)&pIVar15->w),
           auVar21[0xd] = -(*(char *)((long)&pIVar13->w + 1) == *(char *)((long)&pIVar15->w + 1)),
           auVar21[0xe] = -(*(char *)((long)&pIVar13->w + 2) == *(char *)((long)&pIVar15->w + 2)),
           auVar21[0xf] = -(*(char *)((long)&pIVar13->w + 3) == *(char *)((long)&pIVar15->w + 3)),
           (ushort)((ushort)(SUB161(auVar21 >> 7,0) & 1) |
                    (ushort)(SUB161(auVar21 >> 0xf,0) & 1) << 1 |
                    (ushort)(SUB161(auVar21 >> 0x17,0) & 1) << 2 |
                    (ushort)(SUB161(auVar21 >> 0x1f,0) & 1) << 3 |
                    (ushort)(SUB161(auVar21 >> 0x27,0) & 1) << 4 |
                    (ushort)(SUB161(auVar21 >> 0x2f,0) & 1) << 5 |
                    (ushort)(SUB161(auVar21 >> 0x37,0) & 1) << 6 |
                    (ushort)(SUB161(auVar21 >> 0x3f,0) & 1) << 7 |
                    (ushort)(SUB161(auVar21 >> 0x47,0) & 1) << 8 |
                    (ushort)(SUB161(auVar21 >> 0x4f,0) & 1) << 9 |
                    (ushort)(SUB161(auVar21 >> 0x57,0) & 1) << 10 |
                    (ushort)(SUB161(auVar21 >> 0x5f,0) & 1) << 0xb |
                    (ushort)(SUB161(auVar21 >> 0x67,0) & 1) << 0xc |
                    (ushort)(SUB161(auVar21 >> 0x6f,0) & 1) << 0xd |
                    (ushort)(SUB161(auVar21 >> 0x77,0) & 1) << 0xe |
                   (ushort)(auVar21[0xf] >> 7) << 0xf) != 0xffff)) {
          sVar7 = strlen(pcVar6);
          LogText("colors[ImGuiCol_%s]%*s= ImVec4(%.2ff, %.2ff, %.2ff, %.2ff);\n",(double)pIVar15->x
                  ,(double)pIVar15->y,(double)pIVar15->z,(double)pIVar15->w,pcVar6,
                  (ulong)(0x17 - (int)sVar7),"");
        }
        lVar10 = lVar10 + 1;
        pIVar13 = pIVar13 + 1;
        pIVar15 = pIVar15 + 1;
      } while (lVar10 != 0x2a);
      LogFinish();
    }
    SameLine(0.0,-1.0);
    PushItemWidth(120.0);
    Combo("##output_type",&ShowStyleEditor::output_dest,"To Clipboard",-1);
    PopItemWidth();
    SameLine(0.0,-1.0);
    Checkbox("Only Modified Colors",&ShowStyleEditor::output_only_modified);
    Text(
        "Tip: Left-click on colored square to open color picker,\nRight-click to open edit options menu."
        );
    if (ShowStyleEditor(ImGuiStyle*)::filter == '\0') {
      iVar16 = __cxa_guard_acquire(&ShowStyleEditor(ImGuiStyle*)::filter);
      if (iVar16 != 0) {
        ImGuiTextFilter::ImGuiTextFilter(&ShowStyleEditor::filter,"");
        __cxa_atexit(ImGuiTextFilter::~ImGuiTextFilter,&ShowStyleEditor::filter,&__dso_handle);
        __cxa_guard_release(&ShowStyleEditor(ImGuiStyle*)::filter);
      }
    }
    ImGuiTextFilter::Draw(&ShowStyleEditor::filter,"Filter colors",200.0);
    lVar10 = 0;
    RadioButton("Opaque",&ShowStyleEditor::alpha_flags,0);
    SameLine(0.0,-1.0);
    RadioButton("Alpha",&ShowStyleEditor::alpha_flags,0x400);
    SameLine(0.0,-1.0);
    RadioButton("Both",&ShowStyleEditor::alpha_flags,0x800);
    local_d0.x = 0.0;
    local_d0.y = 300.0;
    BeginChild("#colors",(ImVec2 *)&local_d0,true,0x80c000);
    PushItemWidth(-160.0);
    pIVar15 = v->Colors;
    pIVar13 = __dest->Colors;
    do {
      pcVar6 = GetStyleColorName((ImGuiCol)lVar10);
      bVar3 = ImGuiTextFilter::PassFilter(&ShowStyleEditor::filter,pcVar6,(char *)0x0);
      if (bVar3) {
        PushID((ImGuiCol)lVar10);
        ColorEdit4("##color",&pIVar15->x,ShowStyleEditor::alpha_flags | 0x200);
        auVar22[0] = -(*(char *)&pIVar13->x == *(char *)&pIVar15->x);
        auVar22[1] = -(*(char *)((long)&pIVar13->x + 1) == *(char *)((long)&pIVar15->x + 1));
        auVar22[2] = -(*(char *)((long)&pIVar13->x + 2) == *(char *)((long)&pIVar15->x + 2));
        auVar22[3] = -(*(char *)((long)&pIVar13->x + 3) == *(char *)((long)&pIVar15->x + 3));
        auVar22[4] = -(*(char *)&pIVar13->y == *(char *)&pIVar15->y);
        auVar22[5] = -(*(char *)((long)&pIVar13->y + 1) == *(char *)((long)&pIVar15->y + 1));
        auVar22[6] = -(*(char *)((long)&pIVar13->y + 2) == *(char *)((long)&pIVar15->y + 2));
        auVar22[7] = -(*(char *)((long)&pIVar13->y + 3) == *(char *)((long)&pIVar15->y + 3));
        auVar22[8] = -(*(char *)&pIVar13->z == *(char *)&pIVar15->z);
        auVar22[9] = -(*(char *)((long)&pIVar13->z + 1) == *(char *)((long)&pIVar15->z + 1));
        auVar22[10] = -(*(char *)((long)&pIVar13->z + 2) == *(char *)((long)&pIVar15->z + 2));
        auVar22[0xb] = -(*(char *)((long)&pIVar13->z + 3) == *(char *)((long)&pIVar15->z + 3));
        auVar22[0xc] = -(*(char *)&pIVar13->w == *(char *)&pIVar15->w);
        auVar22[0xd] = -(*(char *)((long)&pIVar13->w + 1) == *(char *)((long)&pIVar15->w + 1));
        auVar22[0xe] = -(*(char *)((long)&pIVar13->w + 2) == *(char *)((long)&pIVar15->w + 2));
        auVar22[0xf] = -(*(char *)((long)&pIVar13->w + 3) == *(char *)((long)&pIVar15->w + 3));
        if ((ushort)((ushort)(SUB161(auVar22 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar22 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar22 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar22 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar22 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar22 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar22 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar22 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar22 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar22 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar22 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar22 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar22 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar22 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar22 >> 0x77,0) & 1) << 0xe |
                    (ushort)(auVar22[0xf] >> 7) << 0xf) != 0xffff) {
          SameLine(0.0,(v->ItemInnerSpacing).x);
          local_d0.x = 0.0;
          local_d0.y = 0.0;
          bVar3 = Button("Save",(ImVec2 *)&local_d0);
          if (bVar3) {
            fVar19 = pIVar15->y;
            fVar20 = pIVar15->z;
            fVar2 = pIVar15->w;
            pIVar13->x = pIVar15->x;
            pIVar13->y = fVar19;
            pIVar13->z = fVar20;
            pIVar13->w = fVar2;
          }
          SameLine(0.0,(v->ItemInnerSpacing).x);
          local_d0.x = 0.0;
          local_d0.y = 0.0;
          bVar3 = Button("Revert",(ImVec2 *)&local_d0);
          if (bVar3) {
            fVar19 = pIVar13->y;
            fVar20 = pIVar13->z;
            fVar2 = pIVar13->w;
            pIVar15->x = pIVar13->x;
            pIVar15->y = fVar19;
            pIVar15->z = fVar20;
            pIVar15->w = fVar2;
          }
        }
        SameLine(0.0,(v->ItemInnerSpacing).x);
        TextUnformatted(pcVar6,(char *)0x0);
        PopID();
      }
      lVar10 = lVar10 + 1;
      pIVar13 = pIVar13 + 1;
      pIVar15 = pIVar15 + 1;
    } while (lVar10 != 0x2a);
    PopItemWidth();
    EndChild();
    TreePop();
  }
  pIVar8 = GetIO();
  bVar3 = TreeNode("Fonts","Fonts (%d)",(ulong)(uint)(pIVar8->Fonts->Fonts).Size);
  if (bVar3) {
    pIVar8 = GetIO();
    pIVar14 = pIVar8->Fonts;
    bVar3 = TreeNode("Atlas texture","Atlas texture (%dx%d pixels)",(ulong)(uint)pIVar14->TexWidth,
                     (ulong)(uint)pIVar14->TexHeight);
    if (bVar3) {
      local_38.x = (float)pIVar14->TexWidth;
      local_38.y = (float)pIVar14->TexHeight;
      local_40.x = 0.0;
      local_40.y = 0.0;
      local_48.x = 1.0;
      local_48.y = 1.0;
      local_d0.x = 1.0;
      local_d0.y = 1.0;
      local_d0.z = 1.0;
      local_d0.w = 1.0;
      local_a8.x = 1.0;
      local_a8.y = 1.0;
      local_a8.z = 1.0;
      local_a8.w = 0.5019608;
      Image(pIVar14->TexID,&local_38,&local_40,&local_48,&local_d0,&local_a8);
      TreePop();
    }
    PushItemWidth(100.0);
    if (0 < (pIVar14->Fonts).Size) {
      uVar11 = 0;
      local_98 = pIVar14;
      do {
        pIVar18 = (pIVar14->Fonts).Data[uVar11];
        PushID(pIVar18);
        pcVar6 = pIVar18->ConfigData->Name;
        if (pIVar18->ConfigData == (ImFontConfig *)0x0) {
          pcVar6 = "";
        }
        local_b8 = pIVar18;
        local_90 = uVar11;
        bVar3 = TreeNode(pIVar18,"Font %d: \'%s\', %.2f px, %d glyphs",(double)pIVar18->FontSize,
                         uVar11 & 0xffffffff,pcVar6,(ulong)(uint)(pIVar18->Glyphs).Size);
        SameLine(0.0,-1.0);
        bVar4 = SmallButton("Set as default");
        if (bVar4) {
          pIVar8 = GetIO();
          pIVar8->FontDefault = local_b8;
        }
        pIVar18 = local_b8;
        if (bVar3) {
          PushFont(local_b8);
          Text("The quick brown fox jumps over the lazy dog");
          PopFont();
          DragFloat("Font scale",&pIVar18->Scale,0.005,0.3,2.0,"%.1f",1.0);
          InputFloat("Font offset",&(pIVar18->DisplayOffset).y,1.0,1.0,0,0);
          SameLine(0.0,-1.0);
          ShowHelpMarker(
                        "Note than the default embedded font is NOT meant to be scaled.\n\nFont are currently rendered into bitmaps at a given size at the time of building the atlas. You may oversample them to get some flexibility with scaling. You can also render at multiple sizes and select which one to use at runtime.\n\n(Glimmer of hope: the atlas system should hopefully be rewritten in the future to make scaling more natural and automatic.)"
                        );
          Text("Ascent: %f, Descent: %f, Height: %f",(double)pIVar18->Ascent,
               (double)pIVar18->Descent,(double)(pIVar18->Ascent - pIVar18->Descent));
          Text("Fallback character: \'%c\' (%d)",(ulong)pIVar18->FallbackChar);
          uVar12 = pIVar18->MetricsTotalSurface;
          fVar19 = (float)(int)uVar12;
          if (fVar19 < 0.0) {
            fVar19 = sqrtf(fVar19);
          }
          else {
            fVar19 = SQRT(fVar19);
          }
          fVar20 = (float)local_b8->MetricsTotalSurface;
          if (fVar20 < 0.0) {
            local_b0 = (float *)CONCAT44(local_b0._4_4_,fVar19);
            fVar20 = sqrtf(fVar20);
            fVar19 = local_b0._0_4_;
          }
          else {
            fVar20 = SQRT(fVar20);
          }
          Text("Texture surface: %d pixels (approx) ~ %dx%d",(ulong)uVar12,(ulong)(uint)(int)fVar19,
               (ulong)(uint)(int)fVar20);
          if (0 < local_b8->ConfigDataCount) {
            lVar10 = 0x4c;
            uVar11 = 0;
            do {
              pIVar1 = local_b8->ConfigData;
              if (pIVar1 != (ImFontConfig *)0x0) {
                BulletText("Input %d: \'%s\', Oversample: (%d,%d), PixelSnapH: %d",
                           uVar11 & 0xffffffff,pIVar1->Name + lVar10 + -0x4c,
                           (ulong)*(uint *)(pIVar1->Name + lVar10 + -0x80),
                           (ulong)*(uint *)(pIVar1->Name + lVar10 + -0x7c),
                           (ulong)(byte)pIVar1->Name[lVar10 + -0x78]);
              }
              uVar11 = uVar11 + 1;
              lVar10 = lVar10 + 0x80;
            } while ((long)uVar11 < (long)local_b8->ConfigDataCount);
          }
          bVar3 = TreeNode("Glyphs","Glyphs (%d)",(ulong)(uint)(local_b8->Glyphs).Size);
          if (bVar3) {
            ptr_id = (void *)0x0;
            pIVar18 = local_b8;
            do {
              iVar16 = 0;
              uVar12 = 0;
              do {
                pIVar9 = ImFont::FindGlyphNoFallback(pIVar18,(short)ptr_id + (short)iVar16);
                uVar12 = (uVar12 + 1) - (uint)(pIVar9 == (ImFontGlyph *)0x0);
                iVar16 = iVar16 + 1;
              } while (iVar16 != 0x100);
              if (uVar12 != 0) {
                pcVar6 = "glyphs";
                if (uVar12 == 1) {
                  pcVar6 = "glyph";
                }
                bVar3 = TreeNode(ptr_id,"U+%04X..U+%04X (%d %s)",(ulong)ptr_id & 0xffffffff,
                                 (ulong)((uint)ptr_id | 0xff),(ulong)uVar12,pcVar6);
                if (bVar3) {
                  local_b0 = (float *)CONCAT44(local_b0._4_4_,pIVar18->FontSize);
                  local_bc = (v->ItemSpacing).y;
                  local_78 = GetCursorScreenPos();
                  local_80 = GetWindowDrawList();
                  local_bc = local_bc + local_b0._0_4_;
                  local_68 = local_78.y;
                  fStack_64 = local_78.y;
                  fStack_60 = local_78.y;
                  fStack_5c = local_78.y;
                  uVar11 = 0;
                  local_88 = ptr_id;
                  do {
                    pIVar18 = local_b8;
                    uVar12 = (uint)uVar11;
                    local_d0.x = (float)(uVar12 & 0xf) * local_bc + local_78.x;
                    local_d0.y = (float)(int)(uVar11 >> 4) * local_bc + local_68;
                    local_a8.y = local_d0.y + local_b0._0_4_;
                    local_a8.x = local_d0.x + local_b0._0_4_;
                    uVar17 = (int)local_88 + uVar12;
                    c = (ImWchar)uVar17;
                    pIVar9 = ImFont::FindGlyphNoFallback(local_b8,c);
                    draw_list = local_80;
                    IVar5 = 0x64ffffff;
                    if (pIVar9 == (ImFontGlyph *)0x0) {
                      IVar5 = 0x32ffffff;
                    }
                    ImDrawList::AddRect(local_80,(ImVec2 *)&local_d0,(ImVec2 *)&local_a8,IVar5,0.0,
                                        0xf,1.0);
                    local_58.x = local_d0.x;
                    local_58.y = local_d0.y;
                    uStack_50 = 0;
                    IVar5 = GetColorU32(0,1.0);
                    ImFont::RenderChar(pIVar18,draw_list,local_b0._0_4_,local_58,IVar5,c);
                    if (pIVar9 != (ImFontGlyph *)0x0) {
                      bVar3 = IsMouseHoveringRect((ImVec2 *)&local_d0,(ImVec2 *)&local_a8,true);
                      if (bVar3) {
                        BeginTooltip();
                        Text("Codepoint: U+%04X",(ulong)uVar17);
                        Separator();
                        Text("AdvanceX: %.1f",(double)pIVar9->AdvanceX);
                        Text("Pos: (%.2f,%.2f)->(%.2f,%.2f)",(double)pIVar9->X0,(double)pIVar9->Y0,
                             (double)pIVar9->X1,(double)pIVar9->Y1);
                        Text("UV: (%.3f,%.3f)->(%.3f,%.3f)",(double)pIVar9->U0,(double)pIVar9->V0,
                             (double)pIVar9->U1,(double)pIVar9->V1);
                        EndTooltip();
                      }
                    }
                    ptr_id = local_88;
                    uVar11 = (ulong)(uVar12 + 1);
                  } while (uVar12 + 1 != 0x100);
                  local_d0.y = local_bc * 16.0;
                  local_d0.x = local_bc * 16.0;
                  Dummy((ImVec2 *)&local_d0);
                  TreePop();
                  pIVar18 = local_b8;
                }
              }
              bVar3 = ptr_id < (void *)0xff00;
              ptr_id = (void *)((long)ptr_id + 0x100);
            } while (bVar3);
            TreePop();
            pIVar14 = local_98;
          }
          TreePop();
        }
        PopID();
        uVar11 = local_90 + 1;
      } while ((long)uVar11 < (long)(pIVar14->Fonts).Size);
    }
    DragFloat("this window scale",&ShowStyleEditor::window_scale,0.005,0.3,2.0,"%.1f",1.0);
    pIVar8 = GetIO();
    DragFloat("global scale",&pIVar8->FontGlobalScale,0.005,0.3,2.0,"%.1f",1.0);
    PopItemWidth();
    SetWindowFontScale(ShowStyleEditor::window_scale);
    TreePop();
  }
  PopItemWidth();
  return;
}

Assistant:

void ImGui::ShowStyleEditor(ImGuiStyle* ref)
{
    // You can pass in a reference ImGuiStyle structure to compare to, revert to and save to (else it compares to an internally stored reference)
    ImGuiStyle& style = ImGui::GetStyle();
    static ImGuiStyle ref_saved_style;

    // Default to using internal storage as reference
    static bool init = true;
    if (init && ref == NULL)
        ref_saved_style = style;
    init = false;
    if (ref == NULL)
        ref = &ref_saved_style;

    ImGui::PushItemWidth(ImGui::GetWindowWidth() * 0.50f);

    if (ImGui::ShowStyleSelector("Colors##Selector"))
        ref_saved_style = style;
    ImGui::ShowFontSelector("Fonts##Selector");

    // Simplified Settings
    if (ImGui::SliderFloat("FrameRounding", &style.FrameRounding, 0.0f, 12.0f, "%.0f")) 
        style.GrabRounding = style.FrameRounding; // Make GrabRounding always the same value as FrameRounding
    { bool window_border = (style.WindowBorderSize > 0.0f); if (ImGui::Checkbox("WindowBorder", &window_border)) style.WindowBorderSize = window_border ? 1.0f : 0.0f; }
    ImGui::SameLine();
    { bool frame_border = (style.FrameBorderSize > 0.0f); if (ImGui::Checkbox("FrameBorder", &frame_border)) style.FrameBorderSize = frame_border ? 1.0f : 0.0f; }
    ImGui::SameLine();
    { bool popup_border = (style.PopupBorderSize > 0.0f); if (ImGui::Checkbox("PopupBorder", &popup_border)) style.PopupBorderSize = popup_border ? 1.0f : 0.0f; }

    // Save/Revert button
    if (ImGui::Button("Save Ref"))
        *ref = ref_saved_style = style;
    ImGui::SameLine();
    if (ImGui::Button("Revert Ref"))
        style = *ref;
    ImGui::SameLine();
    ShowHelpMarker("Save/Revert in local non-persistent storage. Default Colors definition are not affected. Use \"Export Colors\" below to save them somewhere.");

    if (ImGui::TreeNode("Rendering"))
    {
        ImGui::Checkbox("Anti-aliased lines", &style.AntiAliasedLines); ImGui::SameLine(); ShowHelpMarker("When disabling anti-aliasing lines, you'll probably want to disable borders in your style as well.");
        ImGui::Checkbox("Anti-aliased fill", &style.AntiAliasedFill);
        ImGui::PushItemWidth(100);
        ImGui::DragFloat("Curve Tessellation Tolerance", &style.CurveTessellationTol, 0.02f, 0.10f, FLT_MAX, NULL, 2.0f);
        if (style.CurveTessellationTol < 0.0f) style.CurveTessellationTol = 0.10f;
        ImGui::DragFloat("Global Alpha", &style.Alpha, 0.005f, 0.20f, 1.0f, "%.2f"); // Not exposing zero here so user doesn't "lose" the UI (zero alpha clips all widgets). But application code could have a toggle to switch between zero and non-zero.
        ImGui::PopItemWidth();
        ImGui::TreePop();
    }

    if (ImGui::TreeNode("Settings"))
    {
        ImGui::SliderFloat2("WindowPadding", (float*)&style.WindowPadding, 0.0f, 20.0f, "%.0f");
        ImGui::SliderFloat("PopupRounding", &style.PopupRounding, 0.0f, 16.0f, "%.0f");
        ImGui::SliderFloat2("FramePadding", (float*)&style.FramePadding, 0.0f, 20.0f, "%.0f");
        ImGui::SliderFloat2("ItemSpacing", (float*)&style.ItemSpacing, 0.0f, 20.0f, "%.0f");
        ImGui::SliderFloat2("ItemInnerSpacing", (float*)&style.ItemInnerSpacing, 0.0f, 20.0f, "%.0f");
        ImGui::SliderFloat2("TouchExtraPadding", (float*)&style.TouchExtraPadding, 0.0f, 10.0f, "%.0f");
        ImGui::SliderFloat("IndentSpacing", &style.IndentSpacing, 0.0f, 30.0f, "%.0f");
        ImGui::SliderFloat("ScrollbarSize", &style.ScrollbarSize, 1.0f, 20.0f, "%.0f");
        ImGui::SliderFloat("GrabMinSize", &style.GrabMinSize, 1.0f, 20.0f, "%.0f");
        ImGui::Text("BorderSize");
        ImGui::SliderFloat("WindowBorderSize", &style.WindowBorderSize, 0.0f, 1.0f, "%.0f");
        ImGui::SliderFloat("ChildBorderSize", &style.ChildBorderSize, 0.0f, 1.0f, "%.0f");
        ImGui::SliderFloat("PopupBorderSize", &style.PopupBorderSize, 0.0f, 1.0f, "%.0f");
        ImGui::SliderFloat("FrameBorderSize", &style.FrameBorderSize, 0.0f, 1.0f, "%.0f");
        ImGui::Text("Rounding");
        ImGui::SliderFloat("WindowRounding", &style.WindowRounding, 0.0f, 14.0f, "%.0f");
        ImGui::SliderFloat("ChildRounding", &style.ChildRounding, 0.0f, 16.0f, "%.0f");
        ImGui::SliderFloat("FrameRounding", &style.FrameRounding, 0.0f, 12.0f, "%.0f");
        ImGui::SliderFloat("ScrollbarRounding", &style.ScrollbarRounding, 0.0f, 12.0f, "%.0f");
        ImGui::SliderFloat("GrabRounding", &style.GrabRounding, 0.0f, 12.0f, "%.0f");
        ImGui::Text("Alignment");
        ImGui::SliderFloat2("WindowTitleAlign", (float*)&style.WindowTitleAlign, 0.0f, 1.0f, "%.2f");
        ImGui::SliderFloat2("ButtonTextAlign", (float*)&style.ButtonTextAlign, 0.0f, 1.0f, "%.2f"); ImGui::SameLine(); ShowHelpMarker("Alignment applies when a button is larger than its text content.");
        ImGui::Text("Safe Area Padding"); ImGui::SameLine(); ShowHelpMarker("Adjust if you cannot see the edges of your screen (e.g. on a TV where scaling has not been configured).");
        ImGui::SliderFloat2("DisplaySafeAreaPadding", (float*)&style.DisplaySafeAreaPadding, 0.0f, 30.0f, "%.0f");
        ImGui::TreePop();
    }

    if (ImGui::TreeNode("Colors"))
    {
        static int output_dest = 0;
        static bool output_only_modified = true;
        if (ImGui::Button("Export Unsaved"))
        {
            if (output_dest == 0)
                ImGui::LogToClipboard();
            else
                ImGui::LogToTTY();
            ImGui::LogText("ImVec4* colors = ImGui::GetStyle().Colors;" IM_NEWLINE);
            for (int i = 0; i < ImGuiCol_COUNT; i++)
            {
                const ImVec4& col = style.Colors[i];
                const char* name = ImGui::GetStyleColorName(i);
                if (!output_only_modified || memcmp(&col, &ref->Colors[i], sizeof(ImVec4)) != 0)
                    ImGui::LogText("colors[ImGuiCol_%s]%*s= ImVec4(%.2ff, %.2ff, %.2ff, %.2ff);" IM_NEWLINE, name, 23-(int)strlen(name), "", col.x, col.y, col.z, col.w);
            }
            ImGui::LogFinish();
        }
        ImGui::SameLine(); ImGui::PushItemWidth(120); ImGui::Combo("##output_type", &output_dest, "To Clipboard\0To TTY\0"); ImGui::PopItemWidth();
        ImGui::SameLine(); ImGui::Checkbox("Only Modified Colors", &output_only_modified);

        ImGui::Text("Tip: Left-click on colored square to open color picker,\nRight-click to open edit options menu.");

        static ImGuiTextFilter filter;
        filter.Draw("Filter colors", 200);

        static ImGuiColorEditFlags alpha_flags = 0;
        ImGui::RadioButton("Opaque", &alpha_flags, 0); ImGui::SameLine(); 
        ImGui::RadioButton("Alpha", &alpha_flags, ImGuiColorEditFlags_AlphaPreview); ImGui::SameLine(); 
        ImGui::RadioButton("Both", &alpha_flags, ImGuiColorEditFlags_AlphaPreviewHalf);

        ImGui::BeginChild("#colors", ImVec2(0, 300), true, ImGuiWindowFlags_AlwaysVerticalScrollbar | ImGuiWindowFlags_AlwaysHorizontalScrollbar | ImGuiWindowFlags_NavFlattened);
        ImGui::PushItemWidth(-160);
        for (int i = 0; i < ImGuiCol_COUNT; i++)
        {
            const char* name = ImGui::GetStyleColorName(i);
            if (!filter.PassFilter(name))
                continue;
            ImGui::PushID(i);
            ImGui::ColorEdit4("##color", (float*)&style.Colors[i], ImGuiColorEditFlags_AlphaBar | alpha_flags);
            if (memcmp(&style.Colors[i], &ref->Colors[i], sizeof(ImVec4)) != 0)
            {
                // Tips: in a real user application, you may want to merge and use an icon font into the main font, so instead of "Save"/"Revert" you'd use icons.
                // Read the FAQ and misc/fonts/README.txt about using icon fonts. It's really easy and super convenient!
                ImGui::SameLine(0.0f, style.ItemInnerSpacing.x); if (ImGui::Button("Save")) ref->Colors[i] = style.Colors[i];
                ImGui::SameLine(0.0f, style.ItemInnerSpacing.x); if (ImGui::Button("Revert")) style.Colors[i] = ref->Colors[i];
            }
            ImGui::SameLine(0.0f, style.ItemInnerSpacing.x);
            ImGui::TextUnformatted(name);
            ImGui::PopID();
        }
        ImGui::PopItemWidth();
        ImGui::EndChild();

        ImGui::TreePop();
    }

    bool fonts_opened = ImGui::TreeNode("Fonts", "Fonts (%d)", ImGui::GetIO().Fonts->Fonts.Size);
    if (fonts_opened)
    {
        ImFontAtlas* atlas = ImGui::GetIO().Fonts;
        if (ImGui::TreeNode("Atlas texture", "Atlas texture (%dx%d pixels)", atlas->TexWidth, atlas->TexHeight))
        {
            ImGui::Image(atlas->TexID, ImVec2((float)atlas->TexWidth, (float)atlas->TexHeight), ImVec2(0,0), ImVec2(1,1), ImColor(255,255,255,255), ImColor(255,255,255,128));
            ImGui::TreePop();
        }
        ImGui::PushItemWidth(100);
        for (int i = 0; i < atlas->Fonts.Size; i++)
        {
            ImFont* font = atlas->Fonts[i];
            ImGui::PushID(font);
            bool font_details_opened = ImGui::TreeNode(font, "Font %d: \'%s\', %.2f px, %d glyphs", i, font->ConfigData ? font->ConfigData[0].Name : "", font->FontSize, font->Glyphs.Size);
            ImGui::SameLine(); if (ImGui::SmallButton("Set as default")) ImGui::GetIO().FontDefault = font;
            if (font_details_opened)
            {
                ImGui::PushFont(font);
                ImGui::Text("The quick brown fox jumps over the lazy dog");
                ImGui::PopFont();
                ImGui::DragFloat("Font scale", &font->Scale, 0.005f, 0.3f, 2.0f, "%.1f");   // Scale only this font
                ImGui::InputFloat("Font offset", &font->DisplayOffset.y, 1, 1, 0);
                ImGui::SameLine(); ShowHelpMarker("Note than the default embedded font is NOT meant to be scaled.\n\nFont are currently rendered into bitmaps at a given size at the time of building the atlas. You may oversample them to get some flexibility with scaling. You can also render at multiple sizes and select which one to use at runtime.\n\n(Glimmer of hope: the atlas system should hopefully be rewritten in the future to make scaling more natural and automatic.)");
                ImGui::Text("Ascent: %f, Descent: %f, Height: %f", font->Ascent, font->Descent, font->Ascent - font->Descent);
                ImGui::Text("Fallback character: '%c' (%d)", font->FallbackChar, font->FallbackChar);
                ImGui::Text("Texture surface: %d pixels (approx) ~ %dx%d", font->MetricsTotalSurface, (int)sqrtf((float)font->MetricsTotalSurface), (int)sqrtf((float)font->MetricsTotalSurface));
                for (int config_i = 0; config_i < font->ConfigDataCount; config_i++)
                    if (ImFontConfig* cfg = &font->ConfigData[config_i])
                        ImGui::BulletText("Input %d: \'%s\', Oversample: (%d,%d), PixelSnapH: %d", config_i, cfg->Name, cfg->OversampleH, cfg->OversampleV, cfg->PixelSnapH);
                if (ImGui::TreeNode("Glyphs", "Glyphs (%d)", font->Glyphs.Size))
                {
                    // Display all glyphs of the fonts in separate pages of 256 characters
                    for (int base = 0; base < 0x10000; base += 256)
                    {
                        int count = 0;
                        for (int n = 0; n < 256; n++)
                            count += font->FindGlyphNoFallback((ImWchar)(base + n)) ? 1 : 0;
                        if (count > 0 && ImGui::TreeNode((void*)(intptr_t)base, "U+%04X..U+%04X (%d %s)", base, base+255, count, count > 1 ? "glyphs" : "glyph"))
                        {
                            float cell_size = font->FontSize * 1;
                            float cell_spacing = style.ItemSpacing.y;
                            ImVec2 base_pos = ImGui::GetCursorScreenPos();
                            ImDrawList* draw_list = ImGui::GetWindowDrawList();
                            for (int n = 0; n < 256; n++)
                            {
                                ImVec2 cell_p1(base_pos.x + (n % 16) * (cell_size + cell_spacing), base_pos.y + (n / 16) * (cell_size + cell_spacing));
                                ImVec2 cell_p2(cell_p1.x + cell_size, cell_p1.y + cell_size);
                                const ImFontGlyph* glyph = font->FindGlyphNoFallback((ImWchar)(base+n));
                                draw_list->AddRect(cell_p1, cell_p2, glyph ? IM_COL32(255,255,255,100) : IM_COL32(255,255,255,50));
                                font->RenderChar(draw_list, cell_size, cell_p1, ImGui::GetColorU32(ImGuiCol_Text), (ImWchar)(base+n)); // We use ImFont::RenderChar as a shortcut because we don't have UTF-8 conversion functions available to generate a string.
                                if (glyph && ImGui::IsMouseHoveringRect(cell_p1, cell_p2))
                                {
                                    ImGui::BeginTooltip();
                                    ImGui::Text("Codepoint: U+%04X", base+n);
                                    ImGui::Separator();
                                    ImGui::Text("AdvanceX: %.1f", glyph->AdvanceX);
                                    ImGui::Text("Pos: (%.2f,%.2f)->(%.2f,%.2f)", glyph->X0, glyph->Y0, glyph->X1, glyph->Y1);
                                    ImGui::Text("UV: (%.3f,%.3f)->(%.3f,%.3f)", glyph->U0, glyph->V0, glyph->U1, glyph->V1);
                                    ImGui::EndTooltip();
                                }
                            }
                            ImGui::Dummy(ImVec2((cell_size + cell_spacing) * 16, (cell_size + cell_spacing) * 16));
                            ImGui::TreePop();
                        }
                    }
                    ImGui::TreePop();
                }
                ImGui::TreePop();
            }
            ImGui::PopID();
        }
        static float window_scale = 1.0f;
        ImGui::DragFloat("this window scale", &window_scale, 0.005f, 0.3f, 2.0f, "%.1f");              // scale only this window
        ImGui::DragFloat("global scale", &ImGui::GetIO().FontGlobalScale, 0.005f, 0.3f, 2.0f, "%.1f"); // scale everything
        ImGui::PopItemWidth();
        ImGui::SetWindowFontScale(window_scale);
        ImGui::TreePop();
    }

    ImGui::PopItemWidth();
}